

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O2

OPENSSL_STACK * OPENSSL_sk_dup(OPENSSL_STACK *sk)

{
  OPENSSL_STACK *sk_00;
  void **ppvVar1;
  
  if ((sk != (OPENSSL_STACK *)0x0) &&
     (sk_00 = (OPENSSL_STACK *)OPENSSL_zalloc(0x28), sk_00 != (OPENSSL_STACK *)0x0)) {
    ppvVar1 = (void **)OPENSSL_memdup(sk->data,sk->num_alloc << 3);
    sk_00->data = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      sk_00->num = sk->num;
      sk_00->sorted = sk->sorted;
      sk_00->num_alloc = sk->num_alloc;
      sk_00->comp = sk->comp;
      return sk_00;
    }
    OPENSSL_sk_free(sk_00);
  }
  return (OPENSSL_STACK *)0x0;
}

Assistant:

OPENSSL_STACK *OPENSSL_sk_dup(const OPENSSL_STACK *sk) {
  if (sk == NULL) {
    return NULL;
  }

  OPENSSL_STACK *ret =
      reinterpret_cast<OPENSSL_STACK *>(OPENSSL_zalloc(sizeof(OPENSSL_STACK)));
  if (ret == NULL) {
    return NULL;
  }

  ret->data = reinterpret_cast<void **>(
      OPENSSL_memdup(sk->data, sizeof(void *) * sk->num_alloc));
  if (ret->data == NULL) {
    goto err;
  }

  ret->num = sk->num;
  ret->sorted = sk->sorted;
  ret->num_alloc = sk->num_alloc;
  ret->comp = sk->comp;
  return ret;

err:
  OPENSSL_sk_free(ret);
  return NULL;
}